

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

void __thiscall wasm::FunctionValidator::visitTableGrow(FunctionValidator *this,TableGrow *curr)

{
  bool bVar1;
  Table *pTVar2;
  
  ValidationInfo::shouldBeTrue<wasm::TableGrow*>
            (this->info,
             (bool)((byte)((((this->
                             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                             ).
                             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                             .
                             super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                            .currModule)->features).features >> 8) & 1),curr,
             "table.grow requires reference types [--enable-reference-types]",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  pTVar2 = Module::getTableOrNull
                     ((this->
                      super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                      ).
                      super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .
                      super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      .currModule,(Name)(curr->table).super_IString.str);
  bVar1 = ValidationInfo::shouldBeTrue<wasm::TableGrow*>
                    (this->info,pTVar2 != (Table *)0x0,curr,"table.grow table must exist",
                     (this->
                     super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                     ).
                     super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .
                     super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .currFunction);
  if ((bVar1) &&
     ((curr->super_SpecificExpression<(wasm::Expression::Id)48>).super_Expression.type.id != 1)) {
    shouldBeSubType(this,(Type)(curr->value->type).id,(Type)(pTVar2->type).id,(Expression *)curr,
                    "table.grow value must have right type");
    ValidationInfo::shouldBeEqual<wasm::TableGrow*,wasm::Type>
              (this->info,(Type)(curr->delta->type).id,(Type)0x2,curr,
               "table.grow must match table index type",
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
               ).
               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .currFunction);
    return;
  }
  return;
}

Assistant:

void FunctionValidator::visitTableGrow(TableGrow* curr) {
  shouldBeTrue(
    getModule()->features.hasReferenceTypes(),
    curr,
    "table.grow requires reference types [--enable-reference-types]");
  auto* table = getModule()->getTableOrNull(curr->table);
  if (shouldBeTrue(!!table, curr, "table.grow table must exist") &&
      curr->type != Type::unreachable) {
    shouldBeSubType(curr->value->type,
                    table->type,
                    curr,
                    "table.grow value must have right type");
    shouldBeEqual(curr->delta->type,
                  Type(Type::i32),
                  curr,
                  "table.grow must match table index type");
  }
}